

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

int __thiscall smf::MidiFile::linkNotePairsFIFO(MidiFile *this)

{
  int iVar1;
  pointer ppMVar2;
  pointer ppMVar3;
  int iVar4;
  long lVar5;
  
  ppMVar2 = (this->m_events).
            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppMVar3 = (this->m_events).
            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)ppMVar3 - (long)ppMVar2) >> 3) < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    do {
      if (ppMVar2[lVar5] != (MidiEventList *)0x0) {
        iVar1 = MidiEventList::linkNotePairsFIFO(ppMVar2[lVar5]);
        iVar4 = iVar4 + iVar1;
        ppMVar2 = (this->m_events).
                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppMVar3 = (this->m_events).
                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)((ulong)((long)ppMVar3 - (long)ppMVar2) >> 3));
  }
  this->m_linkedEventsQ = true;
  return iVar4;
}

Assistant:

int MidiFile::linkNotePairsFIFO(void) {
	int i;
	int sum = 0;
	for (i=0; i<getTrackCount(); i++) {
		if (m_events[i] == NULL) {
			continue;
		}
		sum += m_events[i]->linkNotePairsFIFO();
	}
	m_linkedEventsQ = true;
	return sum;
}